

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::Read3dmV1Layer(ON_BinaryArchive *this,ON_Layer **layer)

{
  ON_ModelComponent *pOVar1;
  uint colorref;
  long lVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ON_Layer *pOVar7;
  wchar_t *component_name;
  char *pcVar8;
  ON__3dmV1LayerIndex *pOVar9;
  ON__3dmV1LayerIndex *p;
  char *s_name;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_58;
  int s_length;
  uint uStack_50;
  ON__UINT32 rgb32;
  ON__UINT64 rgb64;
  ON__INT32 local_40 [2];
  int slen;
  ON__INT64 local_30;
  ON__INT64 big_value;
  ON__UINT32 tcode;
  bool rc;
  ON_String s;
  ON_Layer **layer_local;
  ON_BinaryArchive *this_local;
  
  s.m_s = (char *)layer;
  ON_String::ON_String((ON_String *)&tcode);
  big_value._7_1_ = 0;
  do {
    big_value._0_4_ = 0;
    local_30 = 0;
    bVar4 = BeginRead3dmBigChunk(this,(uint *)&big_value,&local_30);
    if (!bVar4) break;
    if ((int)big_value == 0x400010) {
      pOVar7 = (ON_Layer *)operator_new(0xe8);
      ON_Layer::ON_Layer(pOVar7);
      *(ON_Layer **)s.m_s = pOVar7;
      pOVar1 = *(ON_ModelComponent **)s.m_s;
      iVar5 = this->m_3dm_v1_layer_index;
      this->m_3dm_v1_layer_index = iVar5 + 1;
      ON_ModelComponent::SetIndex(pOVar1,iVar5);
      big_value._7_1_ = 1;
      break;
    }
    bVar4 = EndRead3dmChunk(this);
  } while (bVar4);
  if (*(long *)s.m_s != 0) {
    big_value._7_1_ = 0;
    do {
      big_value._0_4_ = 0;
      local_30 = 0;
      bVar4 = BeginRead3dmBigChunk(this,(uint *)&big_value,&local_30);
      if (!bVar4) goto LAB_004a5a36;
      if ((int)big_value == -0x7fbfffff) {
        _uStack_50 = local_30;
        lVar2 = _uStack_50;
        uStack_50 = (uint)local_30;
        colorref = uStack_50;
        s_length = uStack_50;
        pOVar7 = *(ON_Layer **)s.m_s;
        _uStack_50 = lVar2;
        ON_Color::ON_Color((ON_Color *)&local_58,colorref);
        ON_Layer::SetColor(pOVar7,(ON_Color)local_58);
      }
      else if ((int)big_value == -0x7fbfffcd) {
        if (local_30 == 1) {
          ON_Layer::SetVisible(*(ON_Layer **)s.m_s,false);
          ON_Layer::SetLocked(*(ON_Layer **)s.m_s,false);
        }
        else if (local_30 == 2) {
          ON_Layer::SetVisible(*(ON_Layer **)s.m_s,true);
          ON_Layer::SetLocked(*(ON_Layer **)s.m_s,true);
        }
        else {
          ON_Layer::SetVisible(*(ON_Layer **)s.m_s,true);
          ON_Layer::SetLocked(*(ON_Layer **)s.m_s,false);
        }
      }
      else if ((int)big_value == 0x400011) {
        local_40[0] = 0;
        ReadInt(this,local_40);
        if ((local_40[0] < 0) || (10000 < local_40[0])) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x27eb,"","ON_BinaryArchive::Read3dmV1Layer() - invalid layer name length");
        }
        else {
          ON_String::SetLength((ON_String *)&tcode,(long)local_40[0]);
          iVar5 = ON_String::Length((ON_String *)&tcode);
          pcVar8 = ON_String::Array((ON_String *)&tcode);
          bVar4 = ReadByte(this,(long)iVar5,pcVar8);
          if (bVar4) {
            pOVar1 = *(ON_ModelComponent **)s.m_s;
            ON_wString::ON_wString((ON_wString *)&rgb64,(ON_String *)&tcode);
            component_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&rgb64);
            ON_ModelComponent::SetName(pOVar1,component_name);
            ON_wString::~ON_wString((ON_wString *)&rgb64);
          }
        }
      }
      bVar4 = EndRead3dmChunk(this);
      if (!bVar4) goto LAB_004a5a36;
    } while ((int)big_value != -1);
    big_value._7_1_ = 1;
LAB_004a5a36:
    bVar4 = EndRead3dmChunk(this);
    if (!bVar4) {
      big_value._7_1_ = 0;
    }
  }
  if (((big_value._7_1_ & 1) == 0) && (*(long *)s.m_s != 0)) {
    if (*(long **)s.m_s != (long *)0x0) {
      (**(code **)(**(long **)s.m_s + 0x20))();
    }
    s.m_s[0] = '\0';
    s.m_s[1] = '\0';
    s.m_s[2] = '\0';
    s.m_s[3] = '\0';
    s.m_s[4] = '\0';
    s.m_s[5] = '\0';
    s.m_s[6] = '\0';
    s.m_s[7] = '\0';
  }
  else if (((big_value._7_1_ & 1) != 0) &&
          ((((*(long *)s.m_s != 0 &&
             (ON_ModelComponent::SetId(*(ON_ModelComponent **)s.m_s), this->m_mode == read3dm)) &&
            (this->m_3dm_opennurbs_version == 0)) && (this->m_3dm_version == 1)))) {
    iVar5 = ON_String::Length((ON_String *)&tcode);
    pcVar8 = ON_String::Array((ON_String *)&tcode);
    iVar6 = ON_ModelComponent::Index(*(ON_ModelComponent **)s.m_s);
    if ((((-1 < iVar6) && (0 < iVar5)) && (iVar5 < 0x100)) &&
       ((pcVar8 != (char *)0x0 && (*pcVar8 != '\0')))) {
      pOVar9 = (ON__3dmV1LayerIndex *)oncalloc(1,(long)iVar5 + 0x19);
      pOVar9->m_layer_name = (char *)(pOVar9 + 1);
      iVar6 = ON_ModelComponent::Index(*(ON_ModelComponent **)s.m_s);
      pOVar9->m_layer_index = iVar6;
      pOVar9->m_layer_name_length = iVar5;
      memcpy(pOVar9->m_layer_name,pcVar8,(long)iVar5);
      pOVar9->m_layer_name[iVar5] = '\0';
      pOVar9->m_next = this->m_V1_layer_list;
      this->m_V1_layer_list = pOVar9;
    }
  }
  bVar3 = big_value._7_1_;
  ON_String::~ON_String((ON_String *)&tcode);
  return (bool)(bVar3 & 1);
}

Assistant:

bool ON_BinaryArchive::Read3dmV1Layer( ON_Layer*& layer )
{
  ON_String s;
  bool rc = 0;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  for (;;) 
  {
    tcode = 0;
    big_value = 0;
    if (!BeginRead3dmBigChunk(&tcode,&big_value))
      break; // assume we are at the end of the file
    if ( tcode == TCODE_LAYER ) {
      layer = new ON_Layer();
      layer->SetIndex(m_3dm_v1_layer_index++);
      rc = 1;
      break;
    }
    if (!EndRead3dmChunk())
       break;
  }
  if ( layer ) {
    rc = false;
    for (;;) 
    {
      tcode = 0;
      big_value = 0;
      if (!BeginRead3dmBigChunk(&tcode,&big_value))
        break;
      switch(tcode) 
      {
      case TCODE_LAYERNAME:
        {
          int slen = 0;
          ReadInt(&slen);
          if ( slen < 0 || slen > 10000 )
          {
            ON_ERROR("ON_BinaryArchive::Read3dmV1Layer() - invalid layer name length");
          }
          else
          {
            s.SetLength(slen);
            if ( ReadByte( s.Length(), s.Array() ) )
            {
              layer->SetName(ON_wString(s));
            }
          }
        }
        break;
      case TCODE_RGB:
        {
          ON__UINT64 rgb64 = (ON__UINT64)big_value;
          ON__UINT32 rgb32 = (ON__UINT32)rgb64;
          layer->SetColor( ON_Color((ON__UINT32)rgb32) );
        }
        break;
      case TCODE_LAYERSTATE:
        switch (big_value) 
        {
        case 1: // hidden
          layer->SetVisible(false);
          layer->SetLocked(false);
          break;
        case 2: // locked
          layer->SetVisible(true);
          layer->SetLocked(true);
          break;
        default: // normal
          layer->SetVisible(true);
          layer->SetLocked(false);
          break;
        }
        break;
      }
      if (!EndRead3dmChunk())
         break;
      if ( TCODE_ENDOFTABLE == tcode ) {
        rc = true;
        break;
      }
    }
    if ( !EndRead3dmChunk() ) // end of TCODE_LAYER chunk
      rc = false;
  }
  if ( !rc && layer ) 
  {
    delete layer;
    layer = 0;
  }
  else if (rc && layer)
  {
    // V1 files did not have layer ids.
    layer->SetId();
    if (    ON::archive_mode::read3dm == m_mode
         && 0 == m_3dm_opennurbs_version
         && 1 == m_3dm_version
         )
    {
      // save layer index and name in a linked list.
      int s_length = s.Length();
      const char* s_name = s.Array();
      if (    layer->Index() >= 0
           && s_length > 0
           && s_length < 256
           && 0 != s_name
           && 0 != s_name[0] 
         )
      {
        struct ON__3dmV1LayerIndex* p = (struct ON__3dmV1LayerIndex*)oncalloc(1, sizeof(*p) + (s_length+1)*sizeof(*p->m_layer_name) );
        p->m_layer_name = (char*)(p+1);
        p->m_layer_index = layer->Index();
        p->m_layer_name_length = s_length;
        memcpy(p->m_layer_name,s_name,s_length*sizeof(*p->m_layer_name));
        p->m_layer_name[s_length] = 0;
        p->m_next = m_V1_layer_list;
        m_V1_layer_list = p;
      }
    }
  }
  return rc;
}